

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_boundaries_state.cpp
# Opt level: O1

idx_t duckdb::FindRangeBound<duckdb::LessThan,false>
                (WindowCursor *range_lo,WindowCursor *range_hi,idx_t order_begin,idx_t order_end,
                WindowBoundary range,WindowInputExpression *boundary,idx_t chunk_idx,
                FrameBounds *prev)

{
  PhysicalType PVar1;
  FrameBounds *pFVar2;
  undefined1 auVar3 [12];
  byte bVar4;
  char cVar5;
  bool bVar6;
  bool bVar7;
  short sVar8;
  unsigned_short uVar9;
  uint uVar10;
  int iVar11;
  reference pvVar12;
  OutOfRangeException *pOVar13;
  unsigned_long uVar14;
  InternalException *this;
  ulong uVar15;
  FrameBounds *pFVar16;
  long lVar17;
  long lVar18;
  int64_t ldays;
  long lVar19;
  long lVar20;
  int64_t lmicros;
  idx_t iVar21;
  float fVar22;
  hugeint_t hVar23;
  interval_t iVar24;
  WindowColumnIterator<unsigned_long> WVar25;
  WindowColumnIterator<short> WVar26;
  WindowColumnIterator<unsigned_int> WVar27;
  WindowColumnIterator<signed_char> WVar28;
  WindowColumnIterator<unsigned_short> WVar29;
  WindowColumnIterator<unsigned_char> WVar30;
  WindowColumnIterator<int> WVar31;
  WindowColumnIterator<long> WVar32;
  WindowColumnIterator<duckdb::hugeint_t> WVar33;
  WindowColumnIterator<duckdb::interval_t> WVar34;
  WindowColumnIterator<double> WVar35;
  WindowColumnIterator<float> WVar36;
  WindowColumnIterator<duckdb::uhugeint_t> WVar37;
  WindowColumnIterator<unsigned_long> __last;
  WindowColumnIterator<short> __last_00;
  WindowColumnIterator<unsigned_int> __last_01;
  WindowColumnIterator<signed_char> __last_02;
  WindowColumnIterator<unsigned_short> __last_03;
  WindowColumnIterator<unsigned_char> __last_04;
  WindowColumnIterator<int> __last_05;
  WindowColumnIterator<long> __last_06;
  WindowColumnIterator<duckdb::hugeint_t> __last_07;
  WindowColumnIterator<duckdb::interval_t> __last_08;
  WindowColumnIterator<double> __last_09;
  WindowColumnIterator<float> __last_10;
  WindowColumnIterator<duckdb::uhugeint_t> __last_11;
  double second;
  uchar val;
  OperationCompare<unsigned_char,_duckdb::LessThan> comp;
  double cur_val;
  _Any_data local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  interval_t local_88;
  FrameBounds *local_70;
  _Any_data local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  uhugeint_t local_40;
  
  auVar3 = (undefined1  [12])local_40._4_12_;
  PVar1 = boundary->ptype;
  local_70 = (FrameBounds *)order_end;
  switch(PVar1) {
  case UINT8:
    pvVar12 = vector<duckdb::Vector,_true>::operator[](&boundary->chunk->data,boundary->col_idx);
    pFVar16 = local_70;
    if (boundary->scalar != false) {
      chunk_idx = 0;
    }
    local_88.months._0_1_ = pvVar12->data[chunk_idx];
    local_58._M_allocated_capacity = 0;
    local_58._8_8_ = 0;
    local_68._M_unused._M_object = (void *)0x0;
    local_68._8_8_ = 0;
    if (range == EXPR_PRECEDING_RANGE) {
      bVar4 = WindowCursor::GetCell<unsigned_char>(range_hi,0,(idx_t)((long)&local_70[-1].end + 7));
      if (bVar4 < (byte)local_88.months) {
        pOVar13 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_a8._M_unused._M_object = &local_98;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,"Invalid RANGE PRECEDING value","");
        OutOfRangeException::OutOfRangeException(pOVar13,(string *)&local_a8);
        __cxa_throw(pOVar13,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      bVar4 = WindowCursor::GetCell<unsigned_char>(range_lo,0,order_begin);
      pFVar16 = local_70;
      if ((byte)local_88.months < bVar4) {
        pOVar13 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_a8._M_unused._M_object = &local_98;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,"Invalid RANGE FOLLOWING value","");
        OutOfRangeException::OutOfRangeException(pOVar13,(string *)&local_a8);
        __cxa_throw(pOVar13,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    pFVar2 = (FrameBounds *)prev->start;
    if (pFVar2 < (FrameBounds *)prev->end) {
      if (pFVar2 < pFVar16 && order_begin <= pFVar2) {
        WindowCursor::GetCell<unsigned_char>(range_lo,0,(idx_t)pFVar2);
      }
      pFVar2 = (FrameBounds *)prev->end;
      if (pFVar2 < pFVar16 && order_begin < pFVar2) {
        bVar4 = WindowCursor::GetCell<unsigned_char>(range_hi,0,(idx_t)((long)&pFVar2[-1].end + 7));
        bVar6 = true;
        if ((byte)local_88.months <= bVar4) {
          if ((byte)local_88.months < bVar4) {
            pFVar16 = (FrameBounds *)((long)&((FrameBounds *)prev->end)->start + 1);
            prev = pFVar16;
          }
          else {
            bVar6 = false;
            prev = (FrameBounds *)prev->end;
          }
        }
        if (!bVar6) goto LAB_017cded6;
      }
    }
    ::std::function<bool_(unsigned_char,_unsigned_char)>::function
              ((function<bool_(unsigned_char,_unsigned_char)> *)&local_a8,
               (function<bool_(unsigned_char,_unsigned_char)> *)&local_68);
    WVar30.pos = order_begin;
    WVar30.coll = range_lo;
    __last_04.pos = (pointer)pFVar16;
    __last_04.coll = range_hi;
    WVar30 = ::std::
             upper_bound<duckdb::WindowColumnIterator<unsigned_char>,unsigned_char,duckdb::OperationCompare<unsigned_char,duckdb::LessThan>>
                       (WVar30,__last_04,(uchar *)&local_88,
                        (OperationCompare<unsigned_char,_duckdb::LessThan> *)&local_a8);
    prev = (FrameBounds *)WVar30.pos;
    if ((code *)local_98._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_98._M_allocated_capacity)(&local_a8,&local_a8,3);
    }
LAB_017cded6:
    if ((code *)local_58._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_58._M_allocated_capacity)(&local_68,&local_68,3);
    }
    return (idx_t)prev;
  case INT8:
    pvVar12 = vector<duckdb::Vector,_true>::operator[](&boundary->chunk->data,boundary->col_idx);
    pFVar16 = local_70;
    if (boundary->scalar != false) {
      chunk_idx = 0;
    }
    local_88.months._0_1_ = pvVar12->data[chunk_idx];
    local_58._M_allocated_capacity = 0;
    local_58._8_8_ = 0;
    local_68._M_unused._M_object = (void *)0x0;
    local_68._8_8_ = 0;
    if (range == EXPR_PRECEDING_RANGE) {
      cVar5 = WindowCursor::GetCell<signed_char>(range_hi,0,(idx_t)((long)&local_70[-1].end + 7));
      if (cVar5 < (char)(byte)local_88.months) {
        pOVar13 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_a8._M_unused._M_object = &local_98;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,"Invalid RANGE PRECEDING value","");
        OutOfRangeException::OutOfRangeException(pOVar13,(string *)&local_a8);
        __cxa_throw(pOVar13,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      cVar5 = WindowCursor::GetCell<signed_char>(range_lo,0,order_begin);
      pFVar16 = local_70;
      if ((char)(byte)local_88.months < cVar5) {
        pOVar13 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_a8._M_unused._M_object = &local_98;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,"Invalid RANGE FOLLOWING value","");
        OutOfRangeException::OutOfRangeException(pOVar13,(string *)&local_a8);
        __cxa_throw(pOVar13,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    pFVar2 = (FrameBounds *)prev->start;
    if (pFVar2 < (FrameBounds *)prev->end) {
      if (pFVar2 < pFVar16 && order_begin <= pFVar2) {
        WindowCursor::GetCell<signed_char>(range_lo,0,(idx_t)pFVar2);
      }
      pFVar2 = (FrameBounds *)prev->end;
      if (pFVar2 < pFVar16 && order_begin < pFVar2) {
        cVar5 = WindowCursor::GetCell<signed_char>(range_hi,0,(idx_t)((long)&pFVar2[-1].end + 7));
        bVar6 = true;
        if ((char)(byte)local_88.months <= cVar5) {
          if ((char)(byte)local_88.months < cVar5) {
            pFVar16 = (FrameBounds *)((long)&((FrameBounds *)prev->end)->start + 1);
            prev = pFVar16;
          }
          else {
            bVar6 = false;
            prev = (FrameBounds *)prev->end;
          }
        }
        if (!bVar6) goto LAB_017cde06;
      }
    }
    ::std::function<bool_(signed_char,_signed_char)>::function
              ((function<bool_(signed_char,_signed_char)> *)&local_a8,
               (function<bool_(signed_char,_signed_char)> *)&local_68);
    WVar28.pos = order_begin;
    WVar28.coll = range_lo;
    __last_02.pos = (pointer)pFVar16;
    __last_02.coll = range_hi;
    WVar28 = ::std::
             upper_bound<duckdb::WindowColumnIterator<signed_char>,signed_char,duckdb::OperationCompare<signed_char,duckdb::LessThan>>
                       (WVar28,__last_02,(char *)&local_88,
                        (OperationCompare<signed_char,_duckdb::LessThan> *)&local_a8);
    prev = (FrameBounds *)WVar28.pos;
    if ((code *)local_98._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_98._M_allocated_capacity)(&local_a8,&local_a8,3);
    }
LAB_017cde06:
    if ((code *)local_58._M_allocated_capacity == (code *)0x0) {
      return (idx_t)prev;
    }
    (*(code *)local_58._M_allocated_capacity)(&local_68,&local_68,3);
    return (idx_t)prev;
  case UINT16:
    pvVar12 = vector<duckdb::Vector,_true>::operator[](&boundary->chunk->data,boundary->col_idx);
    pFVar16 = local_70;
    if (boundary->scalar != false) {
      chunk_idx = 0;
    }
    local_88.months._0_2_ = *(undefined2 *)(pvVar12->data + chunk_idx * 2);
    local_58._M_allocated_capacity = 0;
    local_58._8_8_ = 0;
    local_68._M_unused._M_object = (void *)0x0;
    local_68._8_8_ = 0;
    if (range == EXPR_PRECEDING_RANGE) {
      uVar9 = WindowCursor::GetCell<unsigned_short>(range_hi,0,(idx_t)((long)&local_70[-1].end + 7))
      ;
      if (uVar9 < (ushort)local_88.months) {
        pOVar13 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_a8._M_unused._M_object = &local_98;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,"Invalid RANGE PRECEDING value","");
        OutOfRangeException::OutOfRangeException(pOVar13,(string *)&local_a8);
        __cxa_throw(pOVar13,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      uVar9 = WindowCursor::GetCell<unsigned_short>(range_lo,0,order_begin);
      pFVar16 = local_70;
      if ((ushort)local_88.months < uVar9) {
        pOVar13 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_a8._M_unused._M_object = &local_98;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,"Invalid RANGE FOLLOWING value","");
        OutOfRangeException::OutOfRangeException(pOVar13,(string *)&local_a8);
        __cxa_throw(pOVar13,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    pFVar2 = (FrameBounds *)prev->start;
    if (pFVar2 < (FrameBounds *)prev->end) {
      if (pFVar2 < pFVar16 && order_begin <= pFVar2) {
        WindowCursor::GetCell<unsigned_short>(range_lo,0,(idx_t)pFVar2);
      }
      pFVar2 = (FrameBounds *)prev->end;
      if (pFVar2 < pFVar16 && order_begin < pFVar2) {
        uVar9 = WindowCursor::GetCell<unsigned_short>(range_hi,0,(idx_t)((long)&pFVar2[-1].end + 7))
        ;
        bVar6 = true;
        if ((ushort)local_88.months <= uVar9) {
          if ((ushort)local_88.months < uVar9) {
            pFVar16 = (FrameBounds *)((long)&((FrameBounds *)prev->end)->start + 1);
            prev = pFVar16;
          }
          else {
            bVar6 = false;
            prev = (FrameBounds *)prev->end;
          }
        }
        if (!bVar6) goto LAB_017cde6e;
      }
    }
    ::std::function<bool_(unsigned_short,_unsigned_short)>::function
              ((function<bool_(unsigned_short,_unsigned_short)> *)&local_a8,
               (function<bool_(unsigned_short,_unsigned_short)> *)&local_68);
    WVar29.pos = order_begin;
    WVar29.coll = range_lo;
    __last_03.pos = (pointer)pFVar16;
    __last_03.coll = range_hi;
    WVar29 = ::std::
             upper_bound<duckdb::WindowColumnIterator<unsigned_short>,unsigned_short,duckdb::OperationCompare<unsigned_short,duckdb::LessThan>>
                       (WVar29,__last_03,(unsigned_short *)&local_88,
                        (OperationCompare<unsigned_short,_duckdb::LessThan> *)&local_a8);
    prev = (FrameBounds *)WVar29.pos;
    if ((code *)local_98._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_98._M_allocated_capacity)(&local_a8,&local_a8,3);
    }
LAB_017cde6e:
    if ((code *)local_58._M_allocated_capacity == (code *)0x0) {
      return (idx_t)prev;
    }
    (*(code *)local_58._M_allocated_capacity)(&local_68,&local_68,3);
    return (idx_t)prev;
  case INT16:
    pvVar12 = vector<duckdb::Vector,_true>::operator[](&boundary->chunk->data,boundary->col_idx);
    pFVar16 = local_70;
    if (boundary->scalar != false) {
      chunk_idx = 0;
    }
    local_88.months._0_2_ = *(undefined2 *)(pvVar12->data + chunk_idx * 2);
    local_58._M_allocated_capacity = 0;
    local_58._8_8_ = 0;
    local_68._M_unused._M_object = (void *)0x0;
    local_68._8_8_ = 0;
    if (range == EXPR_PRECEDING_RANGE) {
      sVar8 = WindowCursor::GetCell<short>(range_hi,0,(idx_t)((long)&local_70[-1].end + 7));
      if (sVar8 < (short)(ushort)local_88.months) {
        pOVar13 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_a8._M_unused._M_object = &local_98;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,"Invalid RANGE PRECEDING value","");
        OutOfRangeException::OutOfRangeException(pOVar13,(string *)&local_a8);
        __cxa_throw(pOVar13,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      sVar8 = WindowCursor::GetCell<short>(range_lo,0,order_begin);
      pFVar16 = local_70;
      if ((short)(ushort)local_88.months < sVar8) {
        pOVar13 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_a8._M_unused._M_object = &local_98;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,"Invalid RANGE FOLLOWING value","");
        OutOfRangeException::OutOfRangeException(pOVar13,(string *)&local_a8);
        __cxa_throw(pOVar13,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    pFVar2 = (FrameBounds *)prev->start;
    if (pFVar2 < (FrameBounds *)prev->end) {
      if (pFVar2 < pFVar16 && order_begin <= pFVar2) {
        WindowCursor::GetCell<short>(range_lo,0,(idx_t)pFVar2);
      }
      pFVar2 = (FrameBounds *)prev->end;
      if (pFVar2 < pFVar16 && order_begin < pFVar2) {
        sVar8 = WindowCursor::GetCell<short>(range_hi,0,(idx_t)((long)&pFVar2[-1].end + 7));
        bVar6 = true;
        if ((short)(ushort)local_88.months <= sVar8) {
          if ((short)(ushort)local_88.months < sVar8) {
            pFVar16 = (FrameBounds *)((long)&((FrameBounds *)prev->end)->start + 1);
            prev = pFVar16;
          }
          else {
            bVar6 = false;
            prev = (FrameBounds *)prev->end;
          }
        }
        if (!bVar6) goto LAB_017cdd36;
      }
    }
    ::std::function<bool_(short,_short)>::function
              ((function<bool_(short,_short)> *)&local_a8,(function<bool_(short,_short)> *)&local_68
              );
    WVar26.pos = order_begin;
    WVar26.coll = range_lo;
    __last_00.pos = (pointer)pFVar16;
    __last_00.coll = range_hi;
    WVar26 = ::std::
             upper_bound<duckdb::WindowColumnIterator<short>,short,duckdb::OperationCompare<short,duckdb::LessThan>>
                       (WVar26,__last_00,(short *)&local_88,
                        (OperationCompare<short,_duckdb::LessThan> *)&local_a8);
    prev = (FrameBounds *)WVar26.pos;
    if ((code *)local_98._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_98._M_allocated_capacity)(&local_a8,&local_a8,3);
    }
LAB_017cdd36:
    if ((code *)local_58._M_allocated_capacity == (code *)0x0) {
      return (idx_t)prev;
    }
    (*(code *)local_58._M_allocated_capacity)(&local_68,&local_68,3);
    return (idx_t)prev;
  case UINT32:
    pvVar12 = vector<duckdb::Vector,_true>::operator[](&boundary->chunk->data,boundary->col_idx);
    pFVar16 = local_70;
    if (boundary->scalar != false) {
      chunk_idx = 0;
    }
    local_88.months = *(int32_t *)(pvVar12->data + chunk_idx * 4);
    local_58._M_allocated_capacity = 0;
    local_58._8_8_ = 0;
    local_68._M_unused._M_object = (void *)0x0;
    local_68._8_8_ = 0;
    if (range == EXPR_PRECEDING_RANGE) {
      uVar10 = WindowCursor::GetCell<unsigned_int>(range_hi,0,(idx_t)((long)&local_70[-1].end + 7));
      if (uVar10 < (uint)local_88.months) {
        pOVar13 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_a8._M_unused._M_object = &local_98;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,"Invalid RANGE PRECEDING value","");
        OutOfRangeException::OutOfRangeException(pOVar13,(string *)&local_a8);
        __cxa_throw(pOVar13,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      uVar10 = WindowCursor::GetCell<unsigned_int>(range_lo,0,order_begin);
      pFVar16 = local_70;
      if ((uint)local_88.months < uVar10) {
        pOVar13 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_a8._M_unused._M_object = &local_98;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,"Invalid RANGE FOLLOWING value","");
        OutOfRangeException::OutOfRangeException(pOVar13,(string *)&local_a8);
        __cxa_throw(pOVar13,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    pFVar2 = (FrameBounds *)prev->start;
    if (pFVar2 < (FrameBounds *)prev->end) {
      if (pFVar2 < pFVar16 && order_begin <= pFVar2) {
        WindowCursor::GetCell<unsigned_int>(range_lo,0,(idx_t)pFVar2);
      }
      pFVar2 = (FrameBounds *)prev->end;
      if (pFVar2 < pFVar16 && order_begin < pFVar2) {
        uVar10 = WindowCursor::GetCell<unsigned_int>(range_hi,0,(idx_t)((long)&pFVar2[-1].end + 7));
        bVar6 = true;
        if ((uint)local_88.months <= uVar10) {
          if ((uint)local_88.months < uVar10) {
            pFVar16 = (FrameBounds *)((long)&((FrameBounds *)prev->end)->start + 1);
            prev = pFVar16;
          }
          else {
            bVar6 = false;
            prev = (FrameBounds *)prev->end;
          }
        }
        if (!bVar6) goto LAB_017cdd9e;
      }
    }
    ::std::function<bool_(unsigned_int,_unsigned_int)>::function
              ((function<bool_(unsigned_int,_unsigned_int)> *)&local_a8,
               (function<bool_(unsigned_int,_unsigned_int)> *)&local_68);
    WVar27.pos = order_begin;
    WVar27.coll = range_lo;
    __last_01.pos = (pointer)pFVar16;
    __last_01.coll = range_hi;
    WVar27 = ::std::
             upper_bound<duckdb::WindowColumnIterator<unsigned_int>,unsigned_int,duckdb::OperationCompare<unsigned_int,duckdb::LessThan>>
                       (WVar27,__last_01,(uint *)&local_88,
                        (OperationCompare<unsigned_int,_duckdb::LessThan> *)&local_a8);
    prev = (FrameBounds *)WVar27.pos;
    if ((code *)local_98._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_98._M_allocated_capacity)(&local_a8,&local_a8,3);
    }
LAB_017cdd9e:
    if ((code *)local_58._M_allocated_capacity == (code *)0x0) {
      return (idx_t)prev;
    }
    (*(code *)local_58._M_allocated_capacity)(&local_68,&local_68,3);
    return (idx_t)prev;
  case INT32:
    pvVar12 = vector<duckdb::Vector,_true>::operator[](&boundary->chunk->data,boundary->col_idx);
    pFVar16 = local_70;
    if (boundary->scalar != false) {
      chunk_idx = 0;
    }
    local_88.months = *(int32_t *)(pvVar12->data + chunk_idx * 4);
    local_58._M_allocated_capacity = 0;
    local_58._8_8_ = 0;
    local_68._M_unused._M_object = (void *)0x0;
    local_68._8_8_ = 0;
    if (range == EXPR_PRECEDING_RANGE) {
      iVar11 = WindowCursor::GetCell<int>(range_hi,0,(idx_t)((long)&local_70[-1].end + 7));
      if (iVar11 < local_88.months) {
        pOVar13 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_a8._M_unused._M_object = &local_98;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,"Invalid RANGE PRECEDING value","");
        OutOfRangeException::OutOfRangeException(pOVar13,(string *)&local_a8);
        __cxa_throw(pOVar13,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      iVar11 = WindowCursor::GetCell<int>(range_lo,0,order_begin);
      pFVar16 = local_70;
      if (local_88.months < iVar11) {
        pOVar13 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_a8._M_unused._M_object = &local_98;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,"Invalid RANGE FOLLOWING value","");
        OutOfRangeException::OutOfRangeException(pOVar13,(string *)&local_a8);
        __cxa_throw(pOVar13,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    pFVar2 = (FrameBounds *)prev->start;
    if (pFVar2 < (FrameBounds *)prev->end) {
      if (pFVar2 < pFVar16 && order_begin <= pFVar2) {
        WindowCursor::GetCell<int>(range_lo,0,(idx_t)pFVar2);
      }
      pFVar2 = (FrameBounds *)prev->end;
      if (pFVar2 < pFVar16 && order_begin < pFVar2) {
        iVar11 = WindowCursor::GetCell<int>(range_hi,0,(idx_t)((long)&pFVar2[-1].end + 7));
        bVar6 = true;
        if (local_88.months <= iVar11) {
          if (local_88.months < iVar11) {
            pFVar16 = (FrameBounds *)((long)&((FrameBounds *)prev->end)->start + 1);
            prev = pFVar16;
          }
          else {
            bVar6 = false;
            prev = (FrameBounds *)prev->end;
          }
        }
        if (!bVar6) goto LAB_017cdf3e;
      }
    }
    ::std::function<bool_(int,_int)>::function
              ((function<bool_(int,_int)> *)&local_a8,(function<bool_(int,_int)> *)&local_68);
    WVar31.pos = order_begin;
    WVar31.coll = range_lo;
    __last_05.pos = (pointer)pFVar16;
    __last_05.coll = range_hi;
    WVar31 = ::std::
             upper_bound<duckdb::WindowColumnIterator<int>,int,duckdb::OperationCompare<int,duckdb::LessThan>>
                       (WVar31,__last_05,&local_88.months,
                        (OperationCompare<int,_duckdb::LessThan> *)&local_a8);
    prev = (FrameBounds *)WVar31.pos;
    if ((code *)local_98._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_98._M_allocated_capacity)(&local_a8,&local_a8,3);
    }
LAB_017cdf3e:
    if ((code *)local_58._M_allocated_capacity == (code *)0x0) {
      return (idx_t)prev;
    }
    (*(code *)local_58._M_allocated_capacity)(&local_68,&local_68,3);
    return (idx_t)prev;
  case UINT64:
    pvVar12 = vector<duckdb::Vector,_true>::operator[](&boundary->chunk->data,boundary->col_idx);
    pFVar16 = local_70;
    if (boundary->scalar != false) {
      chunk_idx = 0;
    }
    local_88._0_8_ = *(undefined8 *)(pvVar12->data + chunk_idx * 8);
    local_58._M_allocated_capacity = 0;
    local_58._8_8_ = 0;
    local_68._M_unused._M_object = (void *)0x0;
    local_68._8_8_ = 0;
    if (range == EXPR_PRECEDING_RANGE) {
      uVar14 = WindowCursor::GetCell<unsigned_long>(range_hi,0,(idx_t)((long)&local_70[-1].end + 7))
      ;
      if (uVar14 < (ulong)local_88._0_8_) {
        pOVar13 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_a8._M_unused._M_object = &local_98;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,"Invalid RANGE PRECEDING value","");
        OutOfRangeException::OutOfRangeException(pOVar13,(string *)&local_a8);
        __cxa_throw(pOVar13,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      uVar14 = WindowCursor::GetCell<unsigned_long>(range_lo,0,order_begin);
      pFVar16 = local_70;
      if ((ulong)local_88._0_8_ < uVar14) {
        pOVar13 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_a8._M_unused._M_object = &local_98;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,"Invalid RANGE FOLLOWING value","");
        OutOfRangeException::OutOfRangeException(pOVar13,(string *)&local_a8);
        __cxa_throw(pOVar13,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    pFVar2 = (FrameBounds *)prev->start;
    if (pFVar2 < (FrameBounds *)prev->end) {
      if (pFVar2 < pFVar16 && order_begin <= pFVar2) {
        WindowCursor::GetCell<unsigned_long>(range_lo,0,(idx_t)pFVar2);
      }
      pFVar2 = (FrameBounds *)prev->end;
      if (pFVar2 < pFVar16 && order_begin < pFVar2) {
        uVar14 = WindowCursor::GetCell<unsigned_long>(range_hi,0,(idx_t)((long)&pFVar2[-1].end + 7))
        ;
        bVar6 = true;
        if ((ulong)local_88._0_8_ <= uVar14) {
          if ((ulong)local_88._0_8_ < uVar14) {
            pFVar16 = (FrameBounds *)((long)&((FrameBounds *)prev->end)->start + 1);
            prev = pFVar16;
          }
          else {
            bVar6 = false;
            prev = (FrameBounds *)prev->end;
          }
        }
        if (!bVar6) goto LAB_017cdcce;
      }
    }
    ::std::function<bool_(unsigned_long,_unsigned_long)>::function
              ((function<bool_(unsigned_long,_unsigned_long)> *)&local_a8,
               (function<bool_(unsigned_long,_unsigned_long)> *)&local_68);
    WVar25.pos = order_begin;
    WVar25.coll = range_lo;
    __last.pos = (pointer)pFVar16;
    __last.coll = range_hi;
    WVar25 = ::std::
             upper_bound<duckdb::WindowColumnIterator<unsigned_long>,unsigned_long,duckdb::OperationCompare<unsigned_long,duckdb::LessThan>>
                       (WVar25,__last,(unsigned_long *)&local_88,
                        (OperationCompare<unsigned_long,_duckdb::LessThan> *)&local_a8);
    prev = (FrameBounds *)WVar25.pos;
    if ((code *)local_98._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_98._M_allocated_capacity)(&local_a8,&local_a8,3);
    }
LAB_017cdcce:
    if ((code *)local_58._M_allocated_capacity == (code *)0x0) {
      return (idx_t)prev;
    }
    (*(code *)local_58._M_allocated_capacity)(&local_68,&local_68,3);
    return (idx_t)prev;
  case INT64:
    pvVar12 = vector<duckdb::Vector,_true>::operator[](&boundary->chunk->data,boundary->col_idx);
    pFVar16 = local_70;
    if (boundary->scalar != false) {
      chunk_idx = 0;
    }
    local_88._0_8_ = *(undefined8 *)(pvVar12->data + chunk_idx * 8);
    local_58._M_allocated_capacity = 0;
    local_58._8_8_ = 0;
    local_68._M_unused._M_object = (void *)0x0;
    local_68._8_8_ = 0;
    if (range == EXPR_PRECEDING_RANGE) {
      lVar17 = WindowCursor::GetCell<long>(range_hi,0,(idx_t)((long)&local_70[-1].end + 7));
      if (lVar17 < (long)local_88._0_8_) {
        pOVar13 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_a8._M_unused._M_object = &local_98;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,"Invalid RANGE PRECEDING value","");
        OutOfRangeException::OutOfRangeException(pOVar13,(string *)&local_a8);
        __cxa_throw(pOVar13,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      lVar17 = WindowCursor::GetCell<long>(range_lo,0,order_begin);
      pFVar16 = local_70;
      if ((long)local_88._0_8_ < lVar17) {
        pOVar13 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_a8._M_unused._M_object = &local_98;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,"Invalid RANGE FOLLOWING value","");
        OutOfRangeException::OutOfRangeException(pOVar13,(string *)&local_a8);
        __cxa_throw(pOVar13,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    pFVar2 = (FrameBounds *)prev->start;
    if (pFVar2 < (FrameBounds *)prev->end) {
      if (pFVar2 < pFVar16 && order_begin <= pFVar2) {
        WindowCursor::GetCell<long>(range_lo,0,(idx_t)pFVar2);
      }
      pFVar2 = (FrameBounds *)prev->end;
      if (pFVar2 < pFVar16 && order_begin < pFVar2) {
        lVar17 = WindowCursor::GetCell<long>(range_hi,0,(idx_t)((long)&pFVar2[-1].end + 7));
        bVar6 = true;
        if ((long)local_88._0_8_ <= lVar17) {
          if ((long)local_88._0_8_ < lVar17) {
            pFVar16 = (FrameBounds *)((long)&((FrameBounds *)prev->end)->start + 1);
            prev = pFVar16;
          }
          else {
            bVar6 = false;
            prev = (FrameBounds *)prev->end;
          }
        }
        if (!bVar6) goto LAB_017cdfa6;
      }
    }
    ::std::function<bool_(long,_long)>::function
              ((function<bool_(long,_long)> *)&local_a8,(function<bool_(long,_long)> *)&local_68);
    WVar32.pos = order_begin;
    WVar32.coll = range_lo;
    __last_06.pos = (pointer)pFVar16;
    __last_06.coll = range_hi;
    WVar32 = ::std::
             upper_bound<duckdb::WindowColumnIterator<long>,long,duckdb::OperationCompare<long,duckdb::LessThan>>
                       (WVar32,__last_06,(long *)&local_88,
                        (OperationCompare<long,_duckdb::LessThan> *)&local_a8);
    prev = (FrameBounds *)WVar32.pos;
    if ((code *)local_98._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_98._M_allocated_capacity)(&local_a8,&local_a8,3);
    }
LAB_017cdfa6:
    if ((code *)local_58._M_allocated_capacity == (code *)0x0) {
      return (idx_t)prev;
    }
    (*(code *)local_58._M_allocated_capacity)(&local_68,&local_68,3);
    return (idx_t)prev;
  case UINT64|UINT8:
  case DOUBLE|BOOL:
  case DOUBLE|UINT8:
  case DOUBLE|INT8:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
switchD_017cc7f4_caseD_a:
    this = (InternalException *)__cxa_allocate_exception(0x10);
    local_68._M_unused._M_object = &local_58;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"Unsupported column type for RANGE","");
    InternalException::InternalException(this,(string *)&local_68);
    __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case FLOAT:
    local_40._4_12_ = auVar3;
    pvVar12 = vector<duckdb::Vector,_true>::operator[](&boundary->chunk->data,boundary->col_idx);
    pFVar16 = local_70;
    if (boundary->scalar != false) {
      chunk_idx = 0;
    }
    local_88.months = *(int32_t *)(pvVar12->data + chunk_idx * 4);
    local_58._M_allocated_capacity = 0;
    local_58._8_8_ = 0;
    local_68._M_unused._M_object = (void *)0x0;
    local_68._8_8_ = 0;
    if (range == EXPR_PRECEDING_RANGE) {
      local_40.lower._0_4_ =
           WindowCursor::GetCell<float>(range_hi,0,(idx_t)((long)&local_70[-1].end + 7));
      bVar6 = GreaterThan::Operation<float>((float *)&local_88,(float *)&local_40);
      if (bVar6) {
        pOVar13 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_a8._M_unused._M_object = &local_98;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,"Invalid RANGE PRECEDING value","");
        OutOfRangeException::OutOfRangeException(pOVar13,(string *)&local_a8);
        __cxa_throw(pOVar13,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      local_40.lower._0_4_ = WindowCursor::GetCell<float>(range_lo,0,order_begin);
      pFVar16 = local_70;
      bVar6 = GreaterThan::Operation<float>((float *)&local_40,(float *)&local_88);
      if (bVar6) {
        pOVar13 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_a8._M_unused._M_object = &local_98;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,"Invalid RANGE FOLLOWING value","");
        OutOfRangeException::OutOfRangeException(pOVar13,(string *)&local_a8);
        __cxa_throw(pOVar13,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    pFVar2 = (FrameBounds *)prev->start;
    if (pFVar2 < (FrameBounds *)prev->end) {
      if (pFVar2 < pFVar16 && order_begin <= pFVar2) {
        WindowCursor::GetCell<float>(range_lo,0,(idx_t)pFVar2);
      }
      pFVar2 = (FrameBounds *)prev->end;
      if (pFVar2 < pFVar16 && order_begin < pFVar2) {
        fVar22 = WindowCursor::GetCell<float>(range_hi,0,(idx_t)((long)&pFVar2[-1].end + 7));
        local_a8._0_4_ = fVar22;
        bVar7 = GreaterThan::Operation<float>((float *)&local_88,(float *)&local_a8);
        bVar6 = true;
        if (!bVar7) {
          bVar7 = GreaterThan::Operation<float>((float *)&local_a8,(float *)&local_88);
          if (bVar7) {
            pFVar16 = (FrameBounds *)((long)&((FrameBounds *)prev->end)->start + 1);
            prev = pFVar16;
          }
          else {
            bVar6 = false;
            prev = (FrameBounds *)prev->end;
          }
        }
        if (!bVar6) goto LAB_017ce15c;
      }
    }
    ::std::function<bool_(float,_float)>::function
              ((function<bool_(float,_float)> *)&local_a8,(function<bool_(float,_float)> *)&local_68
              );
    WVar36.pos = order_begin;
    WVar36.coll = range_lo;
    __last_10.pos = (pointer)pFVar16;
    __last_10.coll = range_hi;
    WVar36 = ::std::
             upper_bound<duckdb::WindowColumnIterator<float>,float,duckdb::OperationCompare<float,duckdb::LessThan>>
                       (WVar36,__last_10,(float *)&local_88,
                        (OperationCompare<float,_duckdb::LessThan> *)&local_a8);
    prev = (FrameBounds *)WVar36.pos;
    if ((code *)local_98._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_98._M_allocated_capacity)(&local_a8,&local_a8,3);
    }
LAB_017ce15c:
    if ((code *)local_58._M_allocated_capacity == (code *)0x0) {
      return (idx_t)prev;
    }
    (*(code *)local_58._M_allocated_capacity)(&local_68,&local_68,3);
    return (idx_t)prev;
  case DOUBLE:
    pvVar12 = vector<duckdb::Vector,_true>::operator[](&boundary->chunk->data,boundary->col_idx);
    pFVar16 = local_70;
    if (boundary->scalar != false) {
      chunk_idx = 0;
    }
    local_88._0_8_ = *(undefined8 *)(pvVar12->data + chunk_idx * 8);
    local_58._M_allocated_capacity = 0;
    local_58._8_8_ = 0;
    local_68._M_unused._M_object = (void *)0x0;
    local_68._8_8_ = 0;
    if (range == EXPR_PRECEDING_RANGE) {
      local_40.lower =
           (uint64_t)WindowCursor::GetCell<double>(range_hi,0,(idx_t)((long)&local_70[-1].end + 7));
      bVar6 = GreaterThan::Operation<double>((double *)&local_88,(double *)&local_40);
      if (bVar6) {
        pOVar13 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_a8._M_unused._M_object = &local_98;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,"Invalid RANGE PRECEDING value","");
        OutOfRangeException::OutOfRangeException(pOVar13,(string *)&local_a8);
        __cxa_throw(pOVar13,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      local_40.lower = (uint64_t)WindowCursor::GetCell<double>(range_lo,0,order_begin);
      pFVar16 = local_70;
      bVar6 = GreaterThan::Operation<double>((double *)&local_40,(double *)&local_88);
      if (bVar6) {
        pOVar13 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_a8._M_unused._M_object = &local_98;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,"Invalid RANGE FOLLOWING value","");
        OutOfRangeException::OutOfRangeException(pOVar13,(string *)&local_a8);
        __cxa_throw(pOVar13,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    pFVar2 = (FrameBounds *)prev->start;
    if (pFVar2 < (FrameBounds *)prev->end) {
      if (pFVar2 < pFVar16 && order_begin <= pFVar2) {
        WindowCursor::GetCell<double>(range_lo,0,(idx_t)pFVar2);
      }
      pFVar2 = (FrameBounds *)prev->end;
      if (pFVar2 < pFVar16 && order_begin < pFVar2) {
        local_a8._M_unused._0_8_ =
             (undefined8)
             WindowCursor::GetCell<double>(range_hi,0,(idx_t)((long)&pFVar2[-1].end + 7));
        bVar7 = GreaterThan::Operation<double>((double *)&local_88,(double *)&local_a8);
        bVar6 = true;
        if (!bVar7) {
          bVar7 = GreaterThan::Operation<double>((double *)&local_a8,(double *)&local_88);
          if (bVar7) {
            pFVar16 = (FrameBounds *)((long)&((FrameBounds *)prev->end)->start + 1);
            prev = pFVar16;
          }
          else {
            bVar6 = false;
            prev = (FrameBounds *)prev->end;
          }
        }
        if (!bVar6) goto LAB_017ce0f4;
      }
    }
    ::std::function<bool_(double,_double)>::function
              ((function<bool_(double,_double)> *)&local_a8,
               (function<bool_(double,_double)> *)&local_68);
    WVar35.pos = order_begin;
    WVar35.coll = range_lo;
    __last_09.pos = (pointer)pFVar16;
    __last_09.coll = range_hi;
    WVar35 = ::std::
             upper_bound<duckdb::WindowColumnIterator<double>,double,duckdb::OperationCompare<double,duckdb::LessThan>>
                       (WVar35,__last_09,(double *)&local_88,
                        (OperationCompare<double,_duckdb::LessThan> *)&local_a8);
    prev = (FrameBounds *)WVar35.pos;
    if ((code *)local_98._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_98._M_allocated_capacity)(&local_a8,&local_a8,3);
    }
LAB_017ce0f4:
    if ((code *)local_58._M_allocated_capacity == (code *)0x0) {
      return (idx_t)prev;
    }
    (*(code *)local_58._M_allocated_capacity)(&local_68,&local_68,3);
    return (idx_t)prev;
  case INTERVAL:
    break;
  default:
    if (PVar1 != UINT128) {
      if (PVar1 != INT128) goto switchD_017cc7f4_caseD_a;
      pvVar12 = vector<duckdb::Vector,_true>::operator[](&boundary->chunk->data,boundary->col_idx);
      pFVar16 = local_70;
      if (boundary->scalar != false) {
        chunk_idx = 0;
      }
      local_88._0_8_ = *(undefined8 *)(pvVar12->data + chunk_idx * 0x10);
      local_88.micros = *(ulong *)((long)(pvVar12->data + chunk_idx * 0x10) + 8);
      local_58._M_allocated_capacity = 0;
      local_58._8_8_ = 0;
      local_68._M_unused._M_object = (void *)0x0;
      local_68._8_8_ = 0;
      if (range == EXPR_PRECEDING_RANGE) {
        hVar23 = WindowCursor::GetCell<duckdb::hugeint_t>
                           (range_hi,0,(idx_t)((long)&local_70[-1].end + 7));
        if ((hVar23.upper < local_88.micros) ||
           (hVar23.lower < (ulong)local_88._0_8_ && local_88.micros == hVar23.upper)) {
          pOVar13 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
          local_a8._M_unused._M_object = &local_98;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_a8,"Invalid RANGE PRECEDING value","");
          OutOfRangeException::OutOfRangeException(pOVar13,(string *)&local_a8);
          __cxa_throw(pOVar13,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
      else {
        hVar23 = WindowCursor::GetCell<duckdb::hugeint_t>(range_lo,0,order_begin);
        if ((local_88.micros < hVar23.upper) ||
           (pFVar16 = local_70,
           (ulong)local_88._0_8_ < hVar23.lower && hVar23.upper == local_88.micros)) {
          pOVar13 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
          local_a8._M_unused._M_object = &local_98;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_a8,"Invalid RANGE FOLLOWING value","");
          OutOfRangeException::OutOfRangeException(pOVar13,(string *)&local_a8);
          __cxa_throw(pOVar13,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
      pFVar2 = (FrameBounds *)prev->start;
      if (pFVar2 < (FrameBounds *)prev->end) {
        if (pFVar2 < pFVar16 && order_begin <= pFVar2) {
          WindowCursor::GetCell<duckdb::hugeint_t>(range_lo,0,(idx_t)pFVar2);
        }
        pFVar2 = (FrameBounds *)prev->end;
        if (pFVar2 < pFVar16 && order_begin < pFVar2) {
          hVar23 = WindowCursor::GetCell<duckdb::hugeint_t>
                             (range_hi,0,(idx_t)((long)&pFVar2[-1].end + 7));
          uVar15 = hVar23.upper;
          bVar6 = true;
          if ((local_88.micros <= (long)uVar15) &&
             ((ulong)local_88._0_8_ <= hVar23.lower || local_88.micros != uVar15)) {
            if ((local_88.micros < (long)uVar15) ||
               ((ulong)local_88._0_8_ < hVar23.lower && local_88.micros == uVar15)) {
              pFVar16 = (FrameBounds *)((long)&((FrameBounds *)prev->end)->start + 1);
              prev = pFVar16;
            }
            else {
              bVar6 = false;
              prev = (FrameBounds *)prev->end;
            }
          }
          if (!bVar6) goto LAB_017ce012;
        }
      }
      ::std::function<bool_(duckdb::hugeint_t,_duckdb::hugeint_t)>::function
                ((function<bool_(duckdb::hugeint_t,_duckdb::hugeint_t)> *)&local_a8,
                 (function<bool_(duckdb::hugeint_t,_duckdb::hugeint_t)> *)&local_68);
      WVar33.pos = order_begin;
      WVar33.coll = range_lo;
      __last_07.pos = (pointer)pFVar16;
      __last_07.coll = range_hi;
      WVar33 = ::std::
               upper_bound<duckdb::WindowColumnIterator<duckdb::hugeint_t>,duckdb::hugeint_t,duckdb::OperationCompare<duckdb::hugeint_t,duckdb::LessThan>>
                         (WVar33,__last_07,(hugeint_t *)&local_88,
                          (OperationCompare<duckdb::hugeint_t,_duckdb::LessThan> *)&local_a8);
      prev = (FrameBounds *)WVar33.pos;
      if ((code *)local_98._M_allocated_capacity != (code *)0x0) {
        (*(code *)local_98._M_allocated_capacity)(&local_a8,&local_a8,3);
      }
LAB_017ce012:
      if ((code *)local_58._M_allocated_capacity == (code *)0x0) {
        return (idx_t)prev;
      }
      (*(code *)local_58._M_allocated_capacity)(&local_68,&local_68,3);
      return (idx_t)prev;
    }
    pvVar12 = vector<duckdb::Vector,_true>::operator[](&boundary->chunk->data,boundary->col_idx);
    pFVar16 = local_70;
    if (boundary->scalar != false) {
      chunk_idx = 0;
    }
    local_88._0_8_ = *(undefined8 *)(pvVar12->data + chunk_idx * 0x10);
    local_88.micros = *(int64_t *)(pvVar12->data + chunk_idx * 0x10 + 8);
    local_58._M_allocated_capacity = 0;
    local_58._8_8_ = 0;
    local_68._M_unused._M_object = (void *)0x0;
    local_68._8_8_ = 0;
    if (range == EXPR_PRECEDING_RANGE) {
      local_40 = WindowCursor::GetCell<duckdb::uhugeint_t>
                           (range_hi,0,(idx_t)((long)&local_70[-1].end + 7));
      bVar6 = uhugeint_t::operator>((uhugeint_t *)&local_88,&local_40);
      if (bVar6) {
        pOVar13 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_a8._M_unused._M_object = &local_98;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,"Invalid RANGE PRECEDING value","");
        OutOfRangeException::OutOfRangeException(pOVar13,(string *)&local_a8);
        __cxa_throw(pOVar13,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      local_40 = WindowCursor::GetCell<duckdb::uhugeint_t>(range_lo,0,order_begin);
      pFVar16 = local_70;
      bVar6 = uhugeint_t::operator>(&local_40,(uhugeint_t *)&local_88);
      if (bVar6) {
        pOVar13 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_a8._M_unused._M_object = &local_98;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,"Invalid RANGE FOLLOWING value","");
        OutOfRangeException::OutOfRangeException(pOVar13,(string *)&local_a8);
        __cxa_throw(pOVar13,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    pFVar2 = (FrameBounds *)prev->start;
    if (pFVar2 < (FrameBounds *)prev->end) {
      if (pFVar2 < pFVar16 && order_begin <= pFVar2) {
        WindowCursor::GetCell<duckdb::uhugeint_t>(range_lo,0,(idx_t)pFVar2);
      }
      pFVar2 = (FrameBounds *)prev->end;
      if (pFVar2 < pFVar16 && order_begin < pFVar2) {
        local_a8 = (_Any_data)
                   WindowCursor::GetCell<duckdb::uhugeint_t>
                             (range_hi,0,(idx_t)((long)&pFVar2[-1].end + 7));
        bVar7 = uhugeint_t::operator>((uhugeint_t *)&local_88,(uhugeint_t *)&local_a8);
        bVar6 = true;
        if (!bVar7) {
          bVar7 = uhugeint_t::operator>((uhugeint_t *)&local_a8,(uhugeint_t *)&local_88);
          if (bVar7) {
            pFVar16 = (FrameBounds *)((long)&((FrameBounds *)prev->end)->start + 1);
            prev = pFVar16;
          }
          else {
            bVar6 = false;
            prev = (FrameBounds *)prev->end;
          }
        }
        if (!bVar6) goto LAB_017ce1bd;
      }
    }
    ::std::function<bool_(duckdb::uhugeint_t,_duckdb::uhugeint_t)>::function
              ((function<bool_(duckdb::uhugeint_t,_duckdb::uhugeint_t)> *)&local_a8,
               (function<bool_(duckdb::uhugeint_t,_duckdb::uhugeint_t)> *)&local_68);
    WVar37.pos = order_begin;
    WVar37.coll = range_lo;
    __last_11.pos = (pointer)pFVar16;
    __last_11.coll = range_hi;
    WVar37 = ::std::
             upper_bound<duckdb::WindowColumnIterator<duckdb::uhugeint_t>,duckdb::uhugeint_t,duckdb::OperationCompare<duckdb::uhugeint_t,duckdb::LessThan>>
                       (WVar37,__last_11,(uhugeint_t *)&local_88,
                        (OperationCompare<duckdb::uhugeint_t,_duckdb::LessThan> *)&local_a8);
    prev = (FrameBounds *)WVar37.pos;
    if ((code *)local_98._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_98._M_allocated_capacity)(&local_a8,&local_a8,3);
    }
LAB_017ce1bd:
    if ((code *)local_58._M_allocated_capacity == (code *)0x0) {
      return (idx_t)prev;
    }
    (*(code *)local_58._M_allocated_capacity)(&local_68,&local_68,3);
    return (idx_t)prev;
  }
  pvVar12 = vector<duckdb::Vector,_true>::operator[](&boundary->chunk->data,boundary->col_idx);
  if (boundary->scalar != false) {
    chunk_idx = 0;
  }
  local_88._0_8_ = *(undefined8 *)(pvVar12->data + chunk_idx * 0x10);
  local_88.micros = *(int64_t *)(pvVar12->data + chunk_idx * 0x10 + 8);
  local_58._M_allocated_capacity = 0;
  local_58._8_8_ = 0;
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  if (range == EXPR_PRECEDING_RANGE) {
    iVar24 = WindowCursor::GetCell<duckdb::interval_t>(range_hi,0,(long)local_70 - 1);
    lVar17 = (long)local_88.days + local_88.micros / 86400000000;
    lVar19 = lVar17 % 0x1e;
    lVar20 = (long)local_88.months + lVar17 / 0x1e;
    lVar18 = (iVar24._0_8_ >> 0x20) + iVar24.micros / 86400000000;
    lVar17 = lVar18 % 0x1e;
    lVar18 = (long)iVar24.months + lVar18 / 0x1e;
    if ((lVar18 < lVar20) ||
       ((lVar18 <= lVar20 &&
        ((lVar17 < lVar19 ||
         ((lVar17 <= lVar19 && (iVar24.micros % 86400000000 < local_88.micros % 86400000000))))))))
    {
      pOVar13 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
      local_a8._M_unused._M_object = &local_98;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a8,"Invalid RANGE PRECEDING value","");
      OutOfRangeException::OutOfRangeException(pOVar13,(string *)&local_a8);
      __cxa_throw(pOVar13,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  else {
    iVar24 = WindowCursor::GetCell<duckdb::interval_t>(range_lo,0,order_begin);
    lVar17 = (iVar24._0_8_ >> 0x20) + iVar24.micros / 86400000000;
    lVar19 = lVar17 % 0x1e;
    lVar20 = (long)iVar24.months + lVar17 / 0x1e;
    lVar18 = (long)local_88.days + local_88.micros / 86400000000;
    lVar17 = lVar18 % 0x1e;
    lVar18 = (long)local_88.months + lVar18 / 0x1e;
    if ((lVar18 < lVar20) ||
       ((lVar18 <= lVar20 &&
        ((lVar17 < lVar19 ||
         ((lVar17 <= lVar19 && (local_88.micros % 86400000000 < iVar24.micros % 86400000000))))))))
    {
      pOVar13 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
      local_a8._M_unused._M_object = &local_98;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a8,"Invalid RANGE FOLLOWING value","");
      OutOfRangeException::OutOfRangeException(pOVar13,(string *)&local_a8);
      __cxa_throw(pOVar13,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  pFVar16 = local_70;
  uVar15 = prev->start;
  if (uVar15 < prev->end) {
    if (uVar15 < local_70 && order_begin <= uVar15) {
      WindowCursor::GetCell<duckdb::interval_t>(range_lo,0,uVar15);
    }
    uVar15 = prev->end;
    if (uVar15 < pFVar16 && order_begin < uVar15) {
      iVar24 = WindowCursor::GetCell<duckdb::interval_t>(range_hi,0,uVar15 - 1);
      lVar17 = (long)local_88.days + local_88.micros / 86400000000;
      lVar18 = lVar17 % 0x1e;
      lVar19 = (long)local_88.months + lVar17 / 0x1e;
      iVar21 = iVar24.micros % 86400000000;
      lVar17 = (iVar24._0_8_ >> 0x20) + iVar24.micros / 86400000000;
      lVar20 = lVar17 % 0x1e;
      lVar17 = (long)iVar24.months + lVar17 / 0x1e;
      bVar6 = true;
      if ((lVar19 <= lVar17) &&
         ((bVar7 = lVar19 < lVar17, lVar19 < lVar17 ||
          ((lVar18 <= lVar20 &&
           ((lVar18 < lVar20 || (local_88.micros % 86400000000 <= (long)iVar21)))))))) {
        if (lVar19 == lVar17) {
          if (lVar20 <= lVar18) {
            bVar7 = local_88.micros % 86400000000 < (long)iVar21 && lVar18 <= lVar20;
            goto LAB_017cd710;
          }
        }
        else {
LAB_017cd710:
          if (!bVar7) {
            iVar21 = prev->end;
            bVar6 = false;
            goto LAB_017ce048;
          }
        }
        pFVar16 = (FrameBounds *)(prev->end + 1);
      }
LAB_017ce048:
      if (!bVar6) goto LAB_017ce08c;
    }
  }
  ::std::function<bool_(duckdb::interval_t,_duckdb::interval_t)>::function
            ((function<bool_(duckdb::interval_t,_duckdb::interval_t)> *)&local_a8,
             (function<bool_(duckdb::interval_t,_duckdb::interval_t)> *)&local_68);
  WVar34.pos = order_begin;
  WVar34.coll = range_lo;
  __last_08.pos = (pointer)pFVar16;
  __last_08.coll = range_hi;
  WVar34 = ::std::
           upper_bound<duckdb::WindowColumnIterator<duckdb::interval_t>,duckdb::interval_t,duckdb::OperationCompare<duckdb::interval_t,duckdb::LessThan>>
                     (WVar34,__last_08,&local_88,
                      (OperationCompare<duckdb::interval_t,_duckdb::LessThan> *)&local_a8);
  iVar21 = WVar34.pos;
  if ((code *)local_98._M_allocated_capacity != (code *)0x0) {
    (*(code *)local_98._M_allocated_capacity)(&local_a8,&local_a8,3);
  }
LAB_017ce08c:
  if ((code *)local_58._M_allocated_capacity == (code *)0x0) {
    return iVar21;
  }
  (*(code *)local_58._M_allocated_capacity)(&local_68,&local_68,3);
  return iVar21;
}

Assistant:

static idx_t FindRangeBound(WindowCursor &range_lo, WindowCursor &range_hi, const idx_t order_begin,
                            const idx_t order_end, const WindowBoundary range, WindowInputExpression &boundary,
                            const idx_t chunk_idx, const FrameBounds &prev) {
	switch (boundary.InternalType()) {
	case PhysicalType::INT8:
		return FindTypedRangeBound<int8_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                             chunk_idx, prev);
	case PhysicalType::INT16:
		return FindTypedRangeBound<int16_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                              chunk_idx, prev);
	case PhysicalType::INT32:
		return FindTypedRangeBound<int32_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                              chunk_idx, prev);
	case PhysicalType::INT64:
		return FindTypedRangeBound<int64_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                              chunk_idx, prev);
	case PhysicalType::UINT8:
		return FindTypedRangeBound<uint8_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                              chunk_idx, prev);
	case PhysicalType::UINT16:
		return FindTypedRangeBound<uint16_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                               chunk_idx, prev);
	case PhysicalType::UINT32:
		return FindTypedRangeBound<uint32_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                               chunk_idx, prev);
	case PhysicalType::UINT64:
		return FindTypedRangeBound<uint64_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                               chunk_idx, prev);
	case PhysicalType::INT128:
		return FindTypedRangeBound<hugeint_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                                chunk_idx, prev);
	case PhysicalType::UINT128:
		return FindTypedRangeBound<uhugeint_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                                 chunk_idx, prev);
	case PhysicalType::FLOAT:
		return FindTypedRangeBound<float, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                            chunk_idx, prev);
	case PhysicalType::DOUBLE:
		return FindTypedRangeBound<double, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                             chunk_idx, prev);
	case PhysicalType::INTERVAL:
		return FindTypedRangeBound<interval_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                                 chunk_idx, prev);
	default:
		throw InternalException("Unsupported column type for RANGE");
	}
}